

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qualify_binder.cpp
# Opt level: O3

void __thiscall
duckdb::QualifyBinder::QualifyBinder
          (QualifyBinder *this,Binder *binder,ClientContext *context,BoundSelectNode *node,
          BoundGroupInformation *info)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  LogicalType local_30;
  
  ExpressionBinder::ExpressionBinder((ExpressionBinder *)this,binder,context,false);
  (this->super_BaseSelectBinder).inside_window = false;
  (this->super_BaseSelectBinder).bound_aggregate = false;
  (this->super_BaseSelectBinder).node = node;
  (this->super_BaseSelectBinder).info = info;
  (this->super_BaseSelectBinder).super_ExpressionBinder._vptr_ExpressionBinder =
       (_func_int **)&PTR__QualifyBinder_02436ee8;
  ColumnAliasBinder::ColumnAliasBinder(&this->column_alias_binder,&node->bind_state);
  LogicalType::LogicalType(&local_30,BOOLEAN);
  (this->super_BaseSelectBinder).super_ExpressionBinder.target_type.id_ = local_30.id_;
  (this->super_BaseSelectBinder).super_ExpressionBinder.target_type.physical_type_ =
       local_30.physical_type_;
  peVar1 = (this->super_BaseSelectBinder).super_ExpressionBinder.target_type.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (this->super_BaseSelectBinder).super_ExpressionBinder.target_type.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->super_BaseSelectBinder).super_ExpressionBinder.target_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_30.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->super_BaseSelectBinder).super_ExpressionBinder.target_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_30.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_30.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar1;
  local_30.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var2;
  LogicalType::~LogicalType(&local_30);
  return;
}

Assistant:

QualifyBinder::QualifyBinder(Binder &binder, ClientContext &context, BoundSelectNode &node, BoundGroupInformation &info)
    : BaseSelectBinder(binder, context, node, info), column_alias_binder(node.bind_state) {
	target_type = LogicalType(LogicalTypeId::BOOLEAN);
}